

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

bool __thiscall pbrt::SquareMatrix<4>::IsIdentity(SquareMatrix<4> *this)

{
  float fVar1;
  int j;
  int i;
  SquareMatrix<4> *this_local;
  
  i = 0;
  do {
    if (3 < i) {
      return true;
    }
    for (j = 0; j < 4; j = j + 1) {
      if (i == j) {
        fVar1 = this->m[i][j];
        if ((fVar1 != 1.0) || (NAN(fVar1))) {
          return false;
        }
      }
      else {
        fVar1 = this->m[i][j];
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          return false;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool IsIdentity() const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j) {
                if (i == j) {
                    if (m[i][j] != 1)
                        return false;
                } else if (m[i][j] != 0)
                    return false;
            }
        return true;
    }